

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

Var Js::JavascriptOperators::OP_ImportCall
              (JavascriptFunction *function,Var specifier,ScriptContext *scriptContext)

{
  JavascriptLibrary *this;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  ModuleID moduleId;
  BOOL BVar4;
  FunctionBody *this_00;
  JavascriptString *pJVar5;
  DWORD_PTR DVar6;
  Utf8SourceInfo *pUVar7;
  SourceContextInfo *pSVar8;
  undefined4 extraout_var;
  ScriptContext *pSVar9;
  SourceTextModuleRecord *pSVar10;
  size_t sVar11;
  Recycler *this_01;
  long lVar12;
  undefined4 extraout_var_00;
  undefined4 *puVar13;
  JavascriptError *pJVar14;
  Var pvVar15;
  ThreadContext *pTVar16;
  size_t sizeInBytes;
  PCWSTR message;
  size_t size;
  undefined1 local_100 [8];
  JavascriptStackWalker walker;
  void *local_48;
  ModuleRecordBase *moduleRecordBase;
  JavascriptFunction *local_38;
  JavascriptFunction *caller;
  
  local_48 = (void *)0x0;
  this_00 = JavascriptFunction::GetFunctionBody(function);
  pJVar5 = JavascriptConversion::ToString(specifier,scriptContext);
  DVar6 = FunctionProxy::GetHostSourceContext((FunctionProxy *)this_00);
  bVar2 = ParseableFunctionInfo::IsES6ModuleCode(&this_00->super_ParseableFunctionInfo);
  if (DVar6 == 0xffffffffffffffff && !bVar2) {
    pUVar7 = Utf8SourceInfo::GetCallerUtf8SourceInfo
                       ((this_00->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.
                        ptr);
    if (pUVar7 == (Utf8SourceInfo *)0x0) {
      pJVar14 = JavascriptLibrary::CreateError
                          ((scriptContext->super_ScriptContextBase).javascriptLibrary);
      JavascriptError::SetErrorMessageProperties
                (pJVar14,-0x7fffbffb,L"Unable to locate active script or module that calls import()"
                 ,scriptContext);
      pvVar15 = SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise
                          (false,pJVar14,scriptContext,(SourceTextModuleRecord *)0x0,true);
      return pvVar15;
    }
    pUVar7 = Utf8SourceInfo::GetCallerUtf8SourceInfo
                       ((this_00->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.
                        ptr);
    pSVar8 = Utf8SourceInfo::GetSourceContextInfo(pUVar7);
    DVar6 = pSVar8->dwHostSourceContext;
    if (DVar6 == 0xffffffffffffffff) {
      local_38 = (JavascriptFunction *)0x0;
      JavascriptStackWalker::JavascriptStackWalker
                ((JavascriptStackWalker *)local_100,scriptContext,true,(PVOID)0x0,false);
      JavascriptStackWalker::GetCaller((JavascriptStackWalker *)local_100,&local_38,true);
      do {
        BVar4 = JavascriptStackWalker::GetCaller((JavascriptStackWalker *)local_100,&local_38,true);
        if (((BVar4 == 0) || (local_38 == (JavascriptFunction *)0x0)) ||
           (BVar4 = JavascriptFunction::IsScriptFunction(local_38), BVar4 == 0)) {
          pJVar14 = JavascriptLibrary::CreateError
                              ((scriptContext->super_ScriptContextBase).javascriptLibrary);
          JavascriptError::SetErrorMessageProperties
                    (pJVar14,-0x7fffbffb,
                     L"Unable to locate active script or module that calls import()",scriptContext);
          pvVar15 = SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise
                              (false,pJVar14,scriptContext,(SourceTextModuleRecord *)0x0,true);
          JavascriptStackWalker::~JavascriptStackWalker((JavascriptStackWalker *)local_100);
          return pvVar15;
        }
        this_00 = JavascriptFunction::GetFunctionBody(local_38);
        DVar6 = FunctionProxy::GetHostSourceContext((FunctionProxy *)this_00);
        bVar2 = ParseableFunctionInfo::IsES6ModuleCode(&this_00->super_ParseableFunctionInfo);
      } while (DVar6 == 0xffffffffffffffff && !bVar2);
      JavascriptStackWalker::~JavascriptStackWalker((JavascriptStackWalker *)local_100);
    }
  }
  iVar3 = (*(pJVar5->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x65])(pJVar5);
  moduleRecordBase = (ModuleRecordBase *)CONCAT44(extraout_var,iVar3);
  bVar2 = ParseableFunctionInfo::IsES6ModuleCode(&this_00->super_ParseableFunctionInfo);
  if (bVar2) {
    pSVar9 = FunctionProxy::GetScriptContext((FunctionProxy *)this_00);
    this = (pSVar9->super_ScriptContextBase).javascriptLibrary;
    moduleId = FunctionBody::GetModuleID(this_00);
    pSVar10 = JavascriptLibrary::GetModuleRecord(this,moduleId);
    LeaveScriptObject<true,_true,_false>::LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)local_100,scriptContext,
               &stack0xfffffffffffffff8);
    pTVar16 = scriptContext->threadContext;
    bVar2 = pTVar16->reentrancySafeOrHandled;
    pTVar16->reentrancySafeOrHandled = true;
    AutoHandledExceptionType::AutoHandledExceptionType
              ((AutoHandledExceptionType *)&local_38,
               ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
    iVar3 = (*scriptContext->hostScriptContext->_vptr_HostScriptContext[0x12])
                      (scriptContext->hostScriptContext,pSVar10,moduleRecordBase,&local_48);
    AutoHandledExceptionType::~AutoHandledExceptionType((AutoHandledExceptionType *)&local_38);
    ThreadContext::DisposeOnLeaveScript(scriptContext->threadContext);
  }
  else {
    if (DVar6 == 0xffffffffffffffff) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar13 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x284d,
                                  "(dwReferencingSourceContext != Js::Constants::NoHostSourceContext)"
                                  ,
                                  "dwReferencingSourceContext != Js::Constants::NoHostSourceContext"
                                 );
      if (!bVar2) goto LAB_00abea5a;
      *puVar13 = 0;
    }
    LeaveScriptObject<true,_true,_false>::LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)local_100,scriptContext,
               &stack0xfffffffffffffff8);
    pTVar16 = scriptContext->threadContext;
    bVar2 = pTVar16->reentrancySafeOrHandled;
    pTVar16->reentrancySafeOrHandled = true;
    AutoHandledExceptionType::AutoHandledExceptionType
              ((AutoHandledExceptionType *)&local_38,
               ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
    iVar3 = (*scriptContext->hostScriptContext->_vptr_HostScriptContext[0x13])
                      (scriptContext->hostScriptContext,DVar6,moduleRecordBase,&local_48);
    AutoHandledExceptionType::~AutoHandledExceptionType((AutoHandledExceptionType *)&local_38);
    ThreadContext::DisposeOnLeaveScript(scriptContext->threadContext);
  }
  pTVar16->reentrancySafeOrHandled = bVar2;
  LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
            ((LeaveScriptObject<true,_true,_false> *)local_100);
  if (iVar3 < 0) {
    sVar11 = PAL_wcslen((char16_t *)moduleRecordBase);
    walker.entryExitRecord = (ScriptEntryExitRecord *)(sVar11 + 1);
    local_100 = (undefined1  [8])&char16_t::typeinfo;
    walker.scriptContext = (ScriptContext *)0x0;
    walker.nativeLibraryEntry = (Entry *)anon_var_dwarf_4e91f59;
    walker.prevNativeLibraryEntry._0_4_ = 0x2859;
    this_01 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_100);
    lVar12 = sVar11 + 1;
    if (lVar12 == 0) {
      sizeInBytes = 0;
      Memory::Recycler::ClearTrackAllocInfo(this_01,(TrackAllocData *)0x0);
      message = (PCWSTR)&DAT_00000008;
    }
    else {
      sizeInBytes = lVar12 * 2;
      size = 0xffffffffffffffff;
      if (-1 < lVar12) {
        size = sizeInBytes;
      }
      BVar4 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        walker.currentFrame.stackCheckCodeHeight = __tls_get_addr(&PTR_01548f08);
        *(undefined4 *)walker.currentFrame.stackCheckCodeHeight = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar2) goto LAB_00abea5a;
        *(undefined4 *)walker.currentFrame.stackCheckCodeHeight = 0;
      }
      message = (PCWSTR)Memory::Recycler::
                        AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>(this_01,size);
      if (message == (PCWSTR)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar13 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar2) {
LAB_00abea5a:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar13 = 0;
        message = (PCWSTR)0x0;
      }
    }
    memcpy_s(message,sizeInBytes,moduleRecordBase,sVar11 * 2);
    message[sVar11] = L'\0';
    pJVar14 = JavascriptLibrary::CreateURIError
                        ((scriptContext->super_ScriptContextBase).javascriptLibrary);
    JavascriptError::SetErrorMessageProperties(pJVar14,iVar3,message,scriptContext);
    bVar2 = false;
    pSVar10 = (SourceTextModuleRecord *)0x0;
  }
  else {
    pSVar10 = SourceTextModuleRecord::FromHost(local_48);
    pJVar14 = (JavascriptError *)(pSVar10->errorObject).ptr;
    if (pJVar14 == (JavascriptError *)0x0) {
      if ((pSVar10->super_ModuleRecordBase).wasEvaluated != true) {
        pvVar15 = SourceTextModuleRecord::PostProcessDynamicModuleImport(pSVar10);
        return pvVar15;
      }
      iVar3 = (*(pSVar10->super_ModuleRecordBase).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[6])(pSVar10);
      pJVar14 = (JavascriptError *)CONCAT44(extraout_var_00,iVar3);
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
  }
  pvVar15 = SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise
                      (bVar2,pJVar14,scriptContext,pSVar10,true);
  return pvVar15;
}

Assistant:

Var JavascriptOperators::OP_ImportCall(__in JavascriptFunction *function, __in Var specifier, __in ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(ImportCall);
        ModuleRecordBase *moduleRecordBase = nullptr;
        SourceTextModuleRecord *moduleRecord = nullptr;

        FunctionBody* parentFuncBody = function->GetFunctionBody();
        JavascriptString *specifierString = nullptr;

        try
        {
            specifierString = JavascriptConversion::ToString(specifier, scriptContext);
        }
        catch (const JavascriptException &err)
        {
            Var errorObject = err.GetAndClear()->GetThrownObject(scriptContext);
            AssertMsg(errorObject != nullptr, "OP_ImportCall: null error object thrown by ToString(specifier)");
            if (errorObject != nullptr)
            {
                return SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise(false, errorObject, scriptContext);
            }

            Throw::InternalError();
        }

        DWORD_PTR dwReferencingSourceContext = parentFuncBody->GetHostSourceContext();
        if (!parentFuncBody->IsES6ModuleCode() && dwReferencingSourceContext == Js::Constants::NoHostSourceContext)
        {
            // import() called from eval
            if (parentFuncBody->GetUtf8SourceInfo()->GetCallerUtf8SourceInfo() == nullptr)
            {
                JavascriptError *error = scriptContext->GetLibrary()->CreateError();
                JavascriptError::SetErrorMessageProperties(error, E_FAIL, _u("Unable to locate active script or module that calls import()"), scriptContext);
                return SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise(false, error, scriptContext);
            }

            dwReferencingSourceContext = parentFuncBody->GetUtf8SourceInfo()->GetCallerUtf8SourceInfo()->GetSourceContextInfo()->dwHostSourceContext;

            if (dwReferencingSourceContext == Js::Constants::NoHostSourceContext)
            {
                // Walk the call stack if caller function is neither module code nor having host source context

                JavascriptFunction* caller = nullptr;
                Js::JavascriptStackWalker walker(scriptContext);
                walker.GetCaller(&caller);

                do
                {
                    if (walker.GetCaller(&caller) && caller != nullptr && caller->IsScriptFunction())
                    {
                        parentFuncBody = caller->GetFunctionBody();
                        dwReferencingSourceContext = parentFuncBody->GetHostSourceContext();
                    }
                    else
                    {
                        JavascriptError *error = scriptContext->GetLibrary()->CreateError();
                        JavascriptError::SetErrorMessageProperties(error, E_FAIL, _u("Unable to locate active script or module that calls import()"), scriptContext);
                        return SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise(false, error, scriptContext);
                    }

                } while (!parentFuncBody->IsES6ModuleCode() && dwReferencingSourceContext == Js::Constants::NoHostSourceContext);
            }
        }

        LPCOLESTR moduleName = specifierString->GetSz();
        HRESULT hr = 0;

        if (parentFuncBody->IsES6ModuleCode())
        {
            SourceTextModuleRecord *referenceModuleRecord = parentFuncBody->GetScriptContext()->GetLibrary()->GetModuleRecord(parentFuncBody->GetModuleID());
            BEGIN_LEAVE_SCRIPT(scriptContext);
            BEGIN_TRANSLATE_TO_HRESULT(static_cast<ExceptionType>(ExceptionType_OutOfMemory | ExceptionType_StackOverflow));
            hr = scriptContext->GetHostScriptContext()->FetchImportedModule(referenceModuleRecord, moduleName, &moduleRecordBase);
            END_TRANSLATE_EXCEPTION_TO_HRESULT(hr);
            END_LEAVE_SCRIPT(scriptContext);
        }
        else
        {
            Assert(dwReferencingSourceContext != Js::Constants::NoHostSourceContext);
            BEGIN_LEAVE_SCRIPT(scriptContext);
            BEGIN_TRANSLATE_TO_HRESULT(static_cast<ExceptionType>(ExceptionType_OutOfMemory | ExceptionType_StackOverflow));
            hr = scriptContext->GetHostScriptContext()->FetchImportedModuleFromScript(dwReferencingSourceContext, moduleName, &moduleRecordBase);
            END_TRANSLATE_EXCEPTION_TO_HRESULT(hr);
            END_LEAVE_SCRIPT(scriptContext);
        }

        if (FAILED(hr))
        {
            // We cannot just use the buffer in the specifier string - need to make a copy here.
            size_t length = wcslen(moduleName);
            char16* allocatedString = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, length + 1);
            wmemcpy_s(allocatedString, length + 1, moduleName, length);
            allocatedString[length] = _u('\0');

            Js::JavascriptError *error = scriptContext->GetLibrary()->CreateURIError();
            JavascriptError::SetErrorMessageProperties(error, hr, allocatedString, scriptContext);
            return SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise(false, error, scriptContext);
        }

        moduleRecord = SourceTextModuleRecord::FromHost(moduleRecordBase);

        if (moduleRecord->GetErrorObject() != nullptr)
        {
            return SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise(false, moduleRecord->GetErrorObject(), scriptContext, moduleRecord);
        }
        else if (moduleRecord->WasEvaluated())
        {
            return SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise(true, moduleRecord->GetNamespace(), scriptContext, moduleRecord);
        }

        return moduleRecord->PostProcessDynamicModuleImport();
        JIT_HELPER_END(ImportCall);
    }